

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

string * IntToStr_abi_cxx11_(int pos)

{
  int in_ESI;
  string *in_RDI;
  int col;
  int row;
  string *s;
  allocator local_16;
  undefined1 local_15;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  local_10 = GetRow(in_ESI);
  local_14 = GetCol(local_c);
  local_15 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  std::__cxx11::string::operator+=(in_RDI,(char)local_14 + '^');
  std::__cxx11::string::operator+=(in_RDI,(char)local_10 + '0' + (char)P1[local_10]);
  return in_RDI;
}

Assistant:

std::string IntToStr (const int pos){
	int row = GetRow (pos);
	int col = GetCol(pos);
	std::string s = "";
	s += (char) (col - 3 + 'a');
	s += (char) (row + P1[row] + '0');
	return s;
}